

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void vkt::sr::anon_unknown_0::eval_all_bvec3(ShaderEvalContext *c)

{
  int i;
  long lVar1;
  float fVar2;
  float fVar3;
  Vector<bool,_3> res;
  float local_18 [4];
  undefined8 local_8;
  
  local_18[3] = c->in[0].m_data[2];
  local_8 = *(undefined8 *)c->in[0].m_data;
  local_18[2] = 0.0;
  local_18[0] = 0.0;
  local_18[1] = 0.0;
  res.m_data[0] = false;
  res.m_data[1] = false;
  res.m_data[2] = false;
  lVar1 = 0;
  do {
    res.m_data[lVar1] =
         local_18[lVar1] <= local_18[lVar1 + 3] && local_18[lVar1 + 3] != local_18[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar2 = 0.0;
  if (res.m_data[2] != false) {
    fVar2 = 1.0;
  }
  fVar3 = 0.0;
  if (res.m_data[1] != false) {
    fVar3 = fVar2;
  }
  fVar2 = 0.0;
  if (res.m_data[0] != false) {
    fVar2 = fVar3;
  }
  (c->color).m_data[0] = fVar2;
  return;
}

Assistant:

Vector<T, 3>			swizzle		(int a, int b, int c) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); return Vector<T, 3>(m_data[a], m_data[b], m_data[c]); }